

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::getConfigurations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmake *cm)

{
  bool bVar1;
  cmGlobalGenerator *this_00;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *__x;
  reference ppcVar2;
  string local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> makefiles;
  cmake *cm_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  
  makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = cmake::GetGlobalGenerator((cmake *)this);
  __x = cmGlobalGenerator::GetMakefiles(this_00);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_38,__x);
  bVar1 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::empty
                    ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_38);
  if (!bVar1) {
    ppcVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_38,0);
    cmMakefile::GetConfigurations(&local_68,*ppcVar2,__return_storage_ptr__,true);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(__return_storage_ptr__);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(__return_storage_ptr__);
    }
  }
  makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_48 = 1;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_38);
  if ((makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> getConfigurations(const cmake* cm)
{
  std::vector<std::string> configurations;
  auto makefiles = cm->GetGlobalGenerator()->GetMakefiles();
  if (makefiles.empty()) {
    return configurations;
  }

  makefiles[0]->GetConfigurations(configurations);
  if (configurations.empty()) {
    configurations.emplace_back();
  }
  return configurations;
}